

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary_unittest.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_39a3::Test_TemplateDictionary_SetFormattedValue::
Test_TemplateDictionary_SetFormattedValue(Test_TemplateDictionary_SetFormattedValue *this)

{
  value_type local_18;
  Test_TemplateDictionary_SetFormattedValue *local_10;
  Test_TemplateDictionary_SetFormattedValue *this_local;
  
  local_18 = Run;
  local_10 = this;
  std::vector<void_(*)(),_std::allocator<void_(*)()>_>::push_back(&g_testlist,&local_18);
  return;
}

Assistant:

TEST(TemplateDictionary, SetFormattedValue) {
  TemplateDictionary dict("test_SetFormattedValue", NULL);
  TemplateDictionaryPeer peer(&dict);

  dict.SetFormattedValue(TemplateString("PRINTF", sizeof("PRINTF")-1),
                         "%s test %04d", "template test", 1);

  EXPECT_TRUE(peer.ValueIs("PRINTF", "template test test 0001"));
  string dump;
  dict.DumpToString(&dump);
  ASSERT_STRSTR(dump.c_str(), "\n   PRINTF: >template test test 0001<\n");

  // Now test something of size 4k or so, where we can't use scratchbuf
  dict.SetFormattedValue(TemplateString("PRINTF", sizeof("PRINTF")-1),
                         "%s test %04444d", "template test", 2);
  string expected("template test test ");
  for (int i = 0; i < 4443; ++i)
    expected.append("0");
  expected.append("2");
  EXPECT_TRUE(peer.ValueIs("PRINTF", expected));
  string dump2;
  dict.DumpToString(&dump2);
  expected = string("\n   PRINTF: >") + expected + string("<\n");
  ASSERT_STRSTR(dump2.c_str(), expected.c_str());
}